

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLog>
               (GetterXsYs<double> *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  ImPlotPlot *pIVar4;
  float fVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  ImDrawList *this;
  long lVar8;
  int iVar9;
  int iVar10;
  ImPlotContext *gp;
  double dVar11;
  float fVar12;
  float fVar13;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_80;
  double local_78;
  undefined8 uStack_70;
  ImDrawList *local_68;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_68 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar9 = getter->Count;
    local_48 = iVar9 + -1;
    local_40 = line_weight * 0.5;
    lVar8 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    local_78 = *(double *)((long)getter->Xs + lVar8);
    uStack_70 = 0;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar11 = log10(*(double *)((long)getter->Ys + lVar8) /
                   pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar9 = transformer->YAxis;
    pIVar4 = pIVar6->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar9].Range.Min;
    IVar3 = pIVar6->PixelRange[iVar9].Min;
    local_3c.x = (float)(pIVar6->Mx * (local_78 - (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
    local_3c.y = (float)(pIVar6->My[iVar9] *
                         (((double)(float)(dVar11 / pIVar6->LogDenY[iVar9]) *
                           (pIVar4->YAxis[iVar9].Range.Max - dVar2) + dVar2) - dVar2) +
                        (double)IVar3.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog> *)local_58,
               local_68,&pIVar4->PlotRect);
  }
  else {
    iVar9 = getter->Count;
    lVar8 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    local_78 = *(double *)((long)getter->Xs + lVar8);
    uStack_70 = 0;
    dVar11 = log10(*(double *)((long)getter->Ys + lVar8) /
                   pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar9 = transformer->YAxis;
    pIVar4 = pIVar6->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar9].Range.Min;
    IVar3 = pIVar6->PixelRange[iVar9].Min;
    local_58._0_4_ =
         (undefined4)(pIVar6->Mx * (local_78 - (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
    local_58._4_4_ =
         (undefined4)
         (pIVar6->My[iVar9] *
          (((double)(float)(dVar11 / pIVar6->LogDenY[iVar9]) *
            (pIVar4->YAxis[iVar9].Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.y);
    iVar9 = getter->Count;
    if (1 < iVar9) {
      iVar10 = 1;
      do {
        pIVar7 = GImPlot;
        lVar8 = (long)(((getter->Offset + iVar10) % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
        local_78 = *(double *)((long)getter->Xs + lVar8);
        uStack_70 = 0;
        dVar11 = log10(*(double *)((long)getter->Ys + lVar8) /
                       GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        this = local_68;
        iVar9 = transformer->YAxis;
        pIVar4 = pIVar7->CurrentPlot;
        dVar2 = pIVar4->YAxis[iVar9].Range.Min;
        IVar3 = pIVar7->PixelRange[iVar9].Min;
        fVar12 = (float)(pIVar7->Mx * (local_78 - (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
        fVar13 = (float)(pIVar7->My[iVar9] *
                         (((double)(float)(dVar11 / pIVar7->LogDenY[iVar9]) *
                           (pIVar4->YAxis[iVar9].Range.Max - dVar2) + dVar2) - dVar2) +
                        (double)IVar3.y);
        local_60.y = fVar13;
        local_60.x = fVar12;
        pIVar4 = pIVar6->CurrentPlot;
        fVar5 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar5 = fVar13;
        }
        if ((fVar5 < (pIVar4->PlotRect).Max.y) &&
           (fVar5 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                           -(uint)(fVar13 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar5 && fVar5 != *pfVar1)) {
          fVar5 = (float)local_58._0_4_;
          if (fVar12 <= (float)local_58._0_4_) {
            fVar5 = fVar12;
          }
          if ((fVar5 < (pIVar4->PlotRect).Max.x) &&
             (fVar5 = (float)(-(uint)(fVar12 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar12 <= (float)local_58._0_4_) & (uint)fVar12),
             (pIVar4->PlotRect).Min.x <= fVar5 && fVar5 != (pIVar4->PlotRect).Min.x)) {
            local_80.y = (float)local_58._4_4_;
            local_80.x = fVar12;
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_80,col,line_weight);
            ImDrawList::AddLine(this,&local_80,&local_60,col,line_weight);
          }
        }
        iVar10 = iVar10 + 1;
        iVar9 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar10 < iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}